

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask5_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  
  uVar1 = in[6];
  uVar2 = in[7];
  uVar3 = in[9];
  uVar4 = in[8];
  *out = uVar1 << 0x1e | in[5] << 0x19 | in[4] << 0x14 | in[3] << 0xf | in[2] << 10 |
         in[1] << 5 | *in;
  uVar5 = in[0xc];
  uVar6 = in[0xe];
  out[1] = uVar5 << 0x1c | in[0xb] << 0x17 | in[10] << 0x12 |
           uVar3 << 0xd | uVar4 << 8 | uVar2 << 3 | uVar1 >> 2;
  out[2] = in[0xf] << 0xb | uVar6 << 6 | in[0xd] * 2 | uVar5 >> 4;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask5_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (5 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 23;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (5 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 11;
  ++in;

  return out + 1;
}